

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

void __thiscall
wasm::MultiMemoryLowering::Replacer::visitMemoryCopy(Replacer *this,MemoryCopy *curr)

{
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char *pcVar4;
  string_view memory;
  Index index;
  Index sizeIdx;
  LocalSet *localSet;
  Expression *pEVar5;
  long lVar6;
  Type in_R8;
  
  if (this->parent->checkBounds == true) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (this->parent->pointerType).id;
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (this->parent->pointerType).id;
    sizeIdx = Builder::addVar((Builder *)
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                              ).
                              super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                              .
                              super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                              .currFunction,(Function *)0x0,(Name)(auVar3 << 0x40),in_R8);
    memory = (curr->destMemory).super_IString.str;
    localSet = Builder::makeLocalSet(&this->builder,index,curr->source);
    pEVar5 = getDest<wasm::MemoryCopy>
                       (this,curr,(Name)memory,sizeIdx,(Expression *)localSet,(Expression *)0x0);
    curr->dest = pEVar5;
    pEVar5 = getSource(this,curr,sizeIdx,index);
    curr->source = pEVar5;
    uVar1 = (this->parent->pointerType).id;
    pEVar5 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
    pEVar5->_id = LocalGetId;
    *(Index *)(pEVar5 + 1) = sizeIdx;
    (pEVar5->type).id = uVar1;
    lVar6 = 0x20;
  }
  else {
    pEVar5 = getDest<wasm::MemoryCopy>
                       (this,curr,(Name)(curr->destMemory).super_IString.str,0xffffffff,
                        (Expression *)0x0,(Expression *)0x0);
    curr->dest = pEVar5;
    pEVar5 = getSource(this,curr,0xffffffff,0xffffffff);
    lVar6 = 0x18;
  }
  *(Expression **)
   (&(curr->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression._id + lVar6) =
       pEVar5;
  pcVar4 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->destMemory).super_IString.str._M_len =
       (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->destMemory).super_IString.str._M_str = pcVar4;
  pcVar4 = (this->parent->combinedMemory).super_IString.str._M_str;
  (curr->sourceMemory).super_IString.str._M_len =
       (this->parent->combinedMemory).super_IString.str._M_len;
  (curr->sourceMemory).super_IString.str._M_str = pcVar4;
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
      if (parent.checkBounds) {
        Index sourceIdx = Builder::addVar(getFunction(), parent.pointerType);
        Index sizeIdx = Builder::addVar(getFunction(), parent.pointerType);
        curr->dest = getDest(curr,
                             curr->destMemory,
                             sizeIdx,
                             builder.makeLocalSet(sourceIdx, curr->source));
        curr->source = getSource(curr, sizeIdx, sourceIdx);
        curr->size = builder.makeLocalGet(sizeIdx, parent.pointerType);
      } else {
        curr->dest = getDest(curr, curr->destMemory);
        curr->source = getSource(curr);
      }
      curr->destMemory = parent.combinedMemory;
      curr->sourceMemory = parent.combinedMemory;
    }